

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_conversion_set_unit(coda_conversion *conversion,char *unit)

{
  char *pcVar1;
  int iVar2;
  
  if (conversion->unit == (char *)0x0) {
    iVar2 = 0;
    if (unit == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = strdup(unit);
      if (pcVar1 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0xb7);
        return -1;
      }
    }
    conversion->unit = pcVar1;
  }
  else {
    coda_set_error(-400,"conversion already has a unit");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int coda_conversion_set_unit(coda_conversion *conversion, const char *unit)
{
    char *new_unit = NULL;

    if (conversion->unit != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "conversion already has a unit");
        return -1;
    }
    if (unit != NULL)
    {
        new_unit = strdup(unit);
        if (new_unit == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }
    conversion->unit = new_unit;

    return 0;
}